

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O2

void __thiscall
lest::failure::failure(failure *this,location *where_,text *expr_,text *decomposition_)

{
  allocator local_ca;
  allocator local_c9;
  text local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  text local_68;
  location local_48;
  
  std::__cxx11::string::string((string *)&local_68,"failed",&local_c9);
  location::location(&local_48,where_);
  std::operator+(&local_a8,expr_," for ");
  std::operator+(&local_88,&local_a8,decomposition_);
  std::__cxx11::string::string((string *)&local_c8,"",&local_ca);
  message::message(&this->super_message,&local_68,&local_48,&local_88,&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  *(undefined ***)&this->super_message = &PTR__message_0010ec70;
  return;
}

Assistant:

failure( location where_, text expr_, text decomposition_)
    : message{ "failed", where_, expr_ + " for " + decomposition_ } {}